

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O0

void nni_http_set_body(nng_http *conn,void *data,size_t size)

{
  size_t size_local;
  void *data_local;
  nng_http *conn_local;
  
  if ((conn->client & 1U) == 0) {
    http_set_data(&(conn->res).data,data,size);
  }
  else {
    http_set_data(&(conn->req).data,data,size);
  }
  nni_http_set_content_length(conn,size);
  return;
}

Assistant:

void
nni_http_set_body(nng_http *conn, void *data, size_t size)
{
	if (conn->client) {
		http_set_data(&conn->req.data, data, size);
	} else {
		http_set_data(&conn->res.data, data, size);
	}
	nni_http_set_content_length(conn, size);
}